

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool __thiscall
duckdb::ToCStringCastWrapper<duckdb::StringCast>::Operation<duckdb::string_t,duckdb_string>
          (ToCStringCastWrapper<duckdb::StringCast> *this,string_t input,duckdb_string *result)

{
  void *__dest;
  char *__src;
  ulong __n;
  string_t input_00;
  LogicalType local_b0;
  string_t result_string;
  Vector result_vector;
  
  input_00.value._8_8_ = input.value._0_8_;
  LogicalType::LogicalType(&local_b0,VARCHAR);
  Vector::Vector(&result_vector,&local_b0,(data_ptr_t)0x0);
  LogicalType::~LogicalType(&local_b0);
  input_00.value._0_8_ = this;
  result_string = StringCast::Operation<duckdb::string_t>(input_00,&result_vector);
  __n = (ulong)result_string.value._0_4_;
  __src = result_string.value._8_8_;
  if (result_string.value._0_4_ < 0xd) {
    __src = (char *)((long)&result_string.value + 4);
  }
  __dest = malloc(__n + 1);
  switchD_016b0717::default(__dest,__src,__n);
  *(undefined1 *)((long)__dest + __n) = 0;
  *input.value._8_8_ = __dest;
  input.value._8_8_[1] = __n;
  Vector::~Vector(&result_vector);
  return true;
}

Assistant:

static bool Operation(SOURCE_TYPE input, RESULT_TYPE &result) {
		Vector result_vector(LogicalType::VARCHAR, nullptr);
		auto result_string = OP::template Operation<SOURCE_TYPE>(input, result_vector);
		auto result_size = result_string.GetSize();
		auto result_data = result_string.GetData();

		char *allocated_data = char_ptr_cast(duckdb_malloc(result_size + 1));
		memcpy(allocated_data, result_data, result_size);
		allocated_data[result_size] = '\0';
		result.data = allocated_data;
		result.size = result_size;
		return true;
	}